

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O2

void __thiscall myvk::Swapchain::~Swapchain(Swapchain *this)

{
  ~Swapchain(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

Swapchain::~Swapchain() {
	if (m_swapchain) {
		vkDestroySwapchainKHR(m_graphics_queue_ptr->GetDevicePtr()->GetHandle(), m_swapchain, nullptr);
	}
}